

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::parlocalpar(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  uint uVar3;
  uint src;
  size_type sVar4;
  string *__range3;
  char cVar5;
  string localName;
  localVariable variable;
  string local_68;
  value_type local_48;
  
  requireDStackDepth(this,2,"(LOCAL)");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar3 != 0) {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    moveFromDataSpace(this,&local_68,src,(ulong)uVar3);
    if (local_68._M_string_length != 0) {
      sVar4 = 0;
      do {
        cVar2 = local_68._M_dataplus._M_p[sVar4];
        cVar5 = cVar2 + -0x20;
        if (0x19 < (byte)(cVar2 + 0x9fU)) {
          cVar5 = cVar2;
        }
        local_68._M_dataplus._M_p[sVar4] = cVar5;
        sVar4 = sVar4 + 1;
      } while (local_68._M_string_length != sVar4);
    }
    paVar1 = &local_48.localName.field_2;
    local_48.localName._M_string_length = 0;
    local_48.localName.field_2._M_local_buf[0] = '\0';
    local_48.localAddress = 0;
    local_48.localName._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_48.localName,&local_68);
    checkValidHere(this,"ALIGN");
    local_48.localAddress = this->CellSize * 3 + this->dataPointer;
    std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
    push_back(&this->localVariables,&local_48);
    data(this,0x18);
    data(this,5);
    data(this,this->CellSize * 3);
    data(this,4);
    data(this,(int)((ulong)((long)(this->localVariables).
                                  super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->localVariables).
                                 super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333 - 1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.localName._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.localName._M_dataplus._M_p,
                      CONCAT71(local_48.localName.field_2._M_allocated_capacity._1_7_,
                               local_48.localName.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void parlocalpar(){
			REQUIRE_DSTACK_DEPTH(2, "(LOCAL)");
			auto u=dStack.getTop(); dStack.pop();
			auto address=dStack.getTop(); dStack.pop();
			if(u>0){
			std::string localName{};
			moveFromDataSpace(localName,address,u);
			for(auto &c: localName) c=toupper_ascii(c);
			struct localVariable variable{};
			variable.localName=localName;
			align();// in case data() makes alignment;
			auto dataAddress=getDataPointer();
			variable.localAddress=dataAddress+CellSize*3;	
			localVariables.push_back(variable);		
			//data(doLiteralXt); // 1 literal
			//data(dataAddress+CellSize*6);  // 2 address
			//data(storeXt);  // 3 @
			data(localToReturnStackXt);
			data(branchXt);	// 4 	
			data(CellSize * 3);	// 5 Jump 5 to 8 
			data(4);			// 6
			data(localVariables.size()-1);	// 7 init by number of local variable (0,1,)
			}
		}